

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboTestUtil.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::FboTestUtil::FlatColorShader::FlatColorShader
          (FlatColorShader *this,DataType outputType)

{
  GenericVecType type_;
  ShaderProgramDeclaration *pSVar1;
  char *pcVar2;
  allocator<char> local_2e9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  FragmentSource local_248;
  allocator<char> local_221;
  string local_220;
  VertexSource local_200;
  allocator<char> local_1d9;
  string local_1d8;
  Uniform local_1b8;
  FragmentOutput local_190;
  VertexToFragmentVarying local_18c [3];
  allocator<char> local_171;
  string local_170;
  VertexAttribute local_150;
  ShaderProgramDeclaration local_128;
  DataType local_14;
  FlatColorShader *pFStack_10;
  DataType outputType_local;
  FlatColorShader *this_local;
  
  local_14 = outputType;
  pFStack_10 = this;
  sglr::pdec::ShaderProgramDeclaration::ShaderProgramDeclaration(&local_128);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_170,"a_position",&local_171);
  sglr::pdec::VertexAttribute::VertexAttribute(&local_150,&local_170,GENERICVECTYPE_FLOAT);
  pSVar1 = sglr::pdec::ShaderProgramDeclaration::operator<<(&local_128,&local_150);
  sglr::pdec::VertexToFragmentVarying::VertexToFragmentVarying(local_18c,GENERICVECTYPE_FLOAT,0);
  pSVar1 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar1,local_18c);
  type_ = mapDataTypeToGenericVecType(local_14);
  sglr::pdec::FragmentOutput::FragmentOutput(&local_190,type_);
  pSVar1 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar1,&local_190);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d8,"u_color",&local_1d9);
  sglr::pdec::Uniform::Uniform(&local_1b8,&local_1d8,TYPE_FLOAT_VEC4);
  pSVar1 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar1,&local_1b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_220,
             "#version 300 es\nin highp vec4 a_position;\nvoid main (void)\n{\n\tgl_Position = a_position;\n}\n"
             ,&local_221);
  sglr::pdec::VertexSource::VertexSource(&local_200,&local_220);
  pSVar1 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar1,&local_200);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2e8,
             "#version 300 es\nuniform highp vec4 u_color;\nlayout(location = 0) out highp ",
             &local_2e9);
  pcVar2 = glu::getDataTypeName(local_14);
  std::operator+(&local_2c8,&local_2e8,pcVar2);
  std::operator+(&local_2a8,&local_2c8," o_color;\nvoid main (void)\n{\n\to_color = ");
  pcVar2 = glu::getDataTypeName(local_14);
  std::operator+(&local_288,&local_2a8,pcVar2);
  std::operator+(&local_268,&local_288,"(u_color);\n}\n");
  sglr::pdec::FragmentSource::FragmentSource(&local_248,&local_268);
  pSVar1 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar1,&local_248);
  sglr::ShaderProgram::ShaderProgram(&this->super_ShaderProgram,pSVar1);
  sglr::pdec::FragmentSource::~FragmentSource(&local_248);
  std::__cxx11::string::~string((string *)&local_268);
  std::__cxx11::string::~string((string *)&local_288);
  std::__cxx11::string::~string((string *)&local_2a8);
  std::__cxx11::string::~string((string *)&local_2c8);
  std::__cxx11::string::~string((string *)&local_2e8);
  std::allocator<char>::~allocator(&local_2e9);
  sglr::pdec::VertexSource::~VertexSource(&local_200);
  std::__cxx11::string::~string((string *)&local_220);
  std::allocator<char>::~allocator(&local_221);
  sglr::pdec::Uniform::~Uniform(&local_1b8);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::allocator<char>::~allocator(&local_1d9);
  sglr::pdec::VertexAttribute::~VertexAttribute(&local_150);
  std::__cxx11::string::~string((string *)&local_170);
  std::allocator<char>::~allocator(&local_171);
  sglr::pdec::ShaderProgramDeclaration::~ShaderProgramDeclaration(&local_128);
  (this->super_ShaderProgram).super_VertexShader._vptr_VertexShader =
       (_func_int **)&PTR_shadeVertices_015ad870;
  (this->super_ShaderProgram).super_GeometryShader._vptr_GeometryShader =
       (_func_int **)&DAT_015ad8a8;
  (this->super_ShaderProgram).super_FragmentShader._vptr_FragmentShader =
       (_func_int **)&DAT_015ad8c0;
  *(DataType *)&(this->super_ShaderProgram).field_0x154 = local_14;
  return;
}

Assistant:

FlatColorShader::FlatColorShader (glu::DataType outputType)
	: ShaderProgram(sglr::pdec::ShaderProgramDeclaration()
					<< sglr::pdec::VertexAttribute("a_position", rr::GENERICVECTYPE_FLOAT)
					<< sglr::pdec::VertexToFragmentVarying(rr::GENERICVECTYPE_FLOAT)
					<< sglr::pdec::FragmentOutput(mapDataTypeToGenericVecType(outputType))
					<< sglr::pdec::Uniform("u_color", glu::TYPE_FLOAT_VEC4)
					<< sglr::pdec::VertexSource(
							"#version 300 es\n"
							"in highp vec4 a_position;\n"
							"void main (void)\n"
							"{\n"
							"	gl_Position = a_position;\n"
							"}\n")
					<< sglr::pdec::FragmentSource(
							string(
								"#version 300 es\n"
								"uniform highp vec4 u_color;\n"
								"layout(location = 0) out highp ") + glu::getDataTypeName(outputType) + " o_color;\n"
								"void main (void)\n"
								"{\n"
								"	o_color = " + glu::getDataTypeName(outputType) + "(u_color);\n"
								"}\n"))
	, m_outputType(outputType)
{
}